

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_stats.c
# Opt level: O1

void cram_stats_add(cram_stats *st,int32_t val)

{
  int *piVar1;
  khint32_t *pkVar2;
  khint_t kVar3;
  int iVar4;
  khint_t kVar5;
  kh_m_i2i_t *pkVar6;
  byte bVar7;
  uint uVar8;
  khint_t kVar9;
  khint_t kVar10;
  uint uVar11;
  uint uVar12;
  
  st->nsamp = st->nsamp + 1;
  if ((uint)val < 0x400) {
    st->freqs[(uint)val] = st->freqs[(uint)val] + 1;
    return;
  }
  if (st->h == (kh_m_i2i_t *)0x0) {
    pkVar6 = (kh_m_i2i_t *)calloc(1,0x28);
    st->h = pkVar6;
  }
  pkVar6 = st->h;
  if (pkVar6->upper_bound <= pkVar6->n_occupied) {
    uVar11 = pkVar6->n_buckets;
    if (pkVar6->size * 2 < uVar11) {
      kVar9 = uVar11 - 1;
    }
    else {
      kVar9 = uVar11 + 1;
    }
    iVar4 = kh_resize_m_i2i(pkVar6,kVar9);
    if (iVar4 < 0) {
      kVar5 = pkVar6->n_buckets;
      iVar4 = -1;
      goto LAB_0012a040;
    }
  }
  kVar9 = pkVar6->n_buckets;
  kVar5 = kVar9 - 1 & val;
  pkVar2 = pkVar6->flags;
  if ((pkVar2[kVar5 >> 4] >> ((char)kVar5 * '\x02' & 0x1fU) & 2) == 0) {
    iVar4 = 1;
    kVar10 = kVar9;
    uVar11 = kVar5;
    do {
      uVar8 = uVar11 * 2 & 0x1e;
      uVar12 = pkVar2[uVar11 >> 4] >> (sbyte)uVar8;
      kVar3 = kVar9;
      if (((uVar12 & 2) != 0) || (((uVar12 & 1) == 0 && (pkVar6->keys[uVar11] == val)))) break;
      if ((pkVar2[uVar11 >> 4] >> uVar8 & 1) != 0) {
        kVar10 = uVar11;
      }
      uVar11 = uVar11 + iVar4 & kVar9 - 1;
      iVar4 = iVar4 + 1;
      kVar3 = kVar10;
    } while (uVar11 != kVar5);
    kVar5 = kVar3;
    if (kVar3 == kVar9) {
      if (kVar10 == kVar9) {
        kVar10 = uVar11;
      }
      kVar5 = kVar10;
      if ((pkVar2[uVar11 >> 4] >> ((char)uVar11 * '\x02' & 0x1fU) & 2) == 0) {
        kVar5 = uVar11;
      }
    }
  }
  uVar11 = kVar5 >> 4;
  bVar7 = (char)kVar5 * '\x02' & 0x1e;
  if ((pkVar2[uVar11] >> bVar7 & 2) == 0) {
    iVar4 = 0;
    if ((pkVar2[uVar11] >> bVar7 & 1) != 0) {
      pkVar6->keys[kVar5] = val;
      pkVar2[uVar11] = pkVar2[uVar11] & ~(3 << bVar7);
      pkVar6->size = pkVar6->size + 1;
      iVar4 = 2;
    }
  }
  else {
    pkVar6->keys[kVar5] = val;
    pkVar2[uVar11] = pkVar2[uVar11] & ~(3 << bVar7);
    pkVar6->size = pkVar6->size + 1;
    pkVar6->n_occupied = pkVar6->n_occupied + 1;
    iVar4 = 1;
  }
LAB_0012a040:
  if (iVar4 != -1) {
    if (iVar4 == 0) {
      piVar1 = st->h->vals + kVar5;
      *piVar1 = *piVar1 + 1;
    }
    else {
      st->h->vals[kVar5] = 1;
    }
  }
  return;
}

Assistant:

void cram_stats_add(cram_stats *st, int32_t val) {
    st->nsamp++;

    //assert(val >= 0);

    if (val < MAX_STAT_VAL && val >= 0) {
	st->freqs[val]++;
    } else {
	khint_t k;
	int r;

	if (!st->h) {
	    st->h = kh_init(m_i2i);
	}

	k = kh_put(m_i2i, st->h, val, &r);
	if (r == 0)
	    kh_val(st->h, k)++;
	else if (r != -1)
	    kh_val(st->h, k) = 1;
	else
	    ; // FIXME: handle error
    }
}